

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

void __thiscall
slang::ast::EventListControl::serializeTo(EventListControl *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppTVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "events";
  name._M_len = 6;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->events)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppTVar2 = (this->events)._M_ptr;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(TimingControl **)((long)ppTVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void EventListControl::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto const event : events) {
        serializer.serialize(*event);
    }
    serializer.endArray();
}